

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O2

void google::protobuf::uint128::DivModImpl
               (uint128 dividend,uint128 divisor,uint128 *quotient_ret,uint128 *remainder_ret)

{
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  char *pcVar4;
  protobuf *this;
  protobuf *extraout_RDX;
  protobuf *ppVar5;
  uint64 extraout_RDX_00;
  ulong uVar6;
  ulong uVar7;
  protobuf *this_00;
  bool bVar8;
  uint128 n;
  uint128 n_00;
  uint128 local_78;
  protobuf *local_68;
  char *local_60;
  
  pcVar4 = (char *)divisor.hi_;
  this = (protobuf *)divisor.lo_;
  n.lo_ = (char *)dividend.hi_;
  this_00 = (protobuf *)dividend.lo_;
  ppVar5 = this;
  if (this == (protobuf *)0x0 && pcVar4 == (char *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/int128.cc"
               ,0x55);
    pLVar3 = internal::LogMessage::operator<<
                       ((LogMessage *)&local_68,"Division or mod by zero: dividend.hi=");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,(unsigned_long)n.lo_);
    pLVar3 = internal::LogMessage::operator<<(pLVar3,", lo=");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,(unsigned_long)this_00);
    internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar3);
    internal::LogMessage::~LogMessage((LogMessage *)&local_68);
    ppVar5 = extraout_RDX;
  }
  bVar8 = n.lo_ < pcVar4;
  if (pcVar4 == n.lo_) {
    bVar8 = this_00 < this;
  }
  if (bVar8) {
    quotient_ret->lo_ = 0;
    quotient_ret->hi_ = 0;
    remainder_ret->lo_ = (uint64)this_00;
    remainder_ret->hi_ = (uint64)n.lo_;
  }
  else if (this == this_00 && pcVar4 == n.lo_) {
    quotient_ret->lo_ = 1;
    quotient_ret->hi_ = 0;
    remainder_ret->lo_ = 0;
    remainder_ret->hi_ = 0;
  }
  else {
    local_78.lo_ = 1;
    local_78.hi_ = 0;
    n.hi_ = (uint64)ppVar5;
    local_68 = this;
    local_60 = pcVar4;
    iVar1 = Fls128(this_00,n);
    n_00.hi_ = extraout_RDX_00;
    n_00.lo_ = (uint64)pcVar4;
    iVar2 = Fls128(this,n_00);
    operator<<=((uint128 *)&local_68,iVar1 - iVar2);
    operator<<=(&local_78,iVar1 - iVar2);
    uVar6 = 0;
    uVar7 = 0;
    for (; local_78.hi_ != 0 || local_78.lo_ != 0; local_78.hi_ = local_78.hi_ >> 1) {
      bVar8 = local_60 <= n.lo_;
      if (n.lo_ == local_60) {
        bVar8 = local_68 <= this_00;
      }
      if (bVar8) {
        bVar8 = this_00 < local_68;
        this_00 = this_00 + -(long)local_68;
        n.lo_ = n.lo_ + (-(ulong)bVar8 - (long)local_60);
        uVar6 = uVar6 | local_78.hi_;
        uVar7 = uVar7 | local_78.lo_;
      }
      local_78.lo_ = local_78.lo_ >> 1 | local_78.hi_ << 0x3f;
      local_68 = (protobuf *)((ulong)local_68 >> 1 | (long)local_60 << 0x3f);
      local_60 = (char *)((ulong)local_60 >> 1);
    }
    quotient_ret->lo_ = uVar7;
    quotient_ret->hi_ = uVar6;
    remainder_ret->lo_ = (uint64)this_00;
    remainder_ret->hi_ = (uint64)n.lo_;
  }
  return;
}

Assistant:

void uint128::DivModImpl(uint128 dividend, uint128 divisor,
                         uint128* quotient_ret, uint128* remainder_ret) {
  if (divisor == 0) {
    GOOGLE_LOG(FATAL) << "Division or mod by zero: dividend.hi=" << dividend.hi_
                      << ", lo=" << dividend.lo_;
  }

  if (divisor > dividend) {
    *quotient_ret = 0;
    *remainder_ret = dividend;
    return;
  }

  if (divisor == dividend) {
    *quotient_ret = 1;
    *remainder_ret = 0;
    return;
  }

  uint128 denominator = divisor;
  uint128 position = 1;
  uint128 quotient = 0;

  // Left aligns the MSB of the denominator and the dividend.
  int shift = Fls128(dividend) - Fls128(denominator);
  denominator <<= shift;
  position <<= shift;

  // Uses shift-subtract algorithm to divide dividend by denominator. The
  // remainder will be left in dividend.
  while (position > 0) {
    if (dividend >= denominator) {
      dividend -= denominator;
      quotient |= position;
    }
    position >>= 1;
    denominator >>= 1;
  }

  *quotient_ret = quotient;
  *remainder_ret = dividend;
}